

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lights.cpp
# Opt level: O0

SampledSpectrum __thiscall
pbrt::PortalImageInfiniteLight::Phi(PortalImageInfiniteLight *this,SampledWavelengths *lambda)

{
  undefined8 uVar1;
  undefined8 uVar2;
  array<float,_4> aVar3;
  Float *pFVar4;
  Point2i PVar5;
  long in_RDI;
  Image *this_00;
  ulong extraout_XMM0_Qb;
  undefined1 auVar6 [64];
  undefined1 auVar7 [64];
  undefined1 auVar8 [64];
  undefined1 auVar9 [64];
  ulong uVar11;
  undefined1 auVar10 [64];
  undefined1 auVar13 [64];
  undefined1 auVar14 [64];
  undefined1 auVar15 [64];
  undefined1 auVar16 [64];
  Vector3f VVar18;
  SampledSpectrum SVar19;
  Float duv_dw;
  Point2f st;
  int c;
  RGB rgb;
  int x;
  int y;
  SampledSpectrum sumL;
  float in_stack_fffffffffffffe98;
  Float in_stack_fffffffffffffe9c;
  undefined4 uVar20;
  SampledSpectrum *in_stack_fffffffffffffea0;
  undefined4 in_stack_fffffffffffffea8;
  WrapMode in_stack_fffffffffffffeac;
  int iVar21;
  float in_stack_fffffffffffffeb0;
  undefined4 in_stack_fffffffffffffeb4;
  SampledWavelengths *in_stack_fffffffffffffed8;
  int in_stack_fffffffffffffee0;
  Float in_stack_fffffffffffffee4;
  PortalImageInfiniteLight *in_stack_ffffffffffffff00;
  RGBColorSpace *in_stack_ffffffffffffff08;
  PortalImageInfiniteLight *in_stack_ffffffffffffff10;
  Image *in_stack_ffffffffffffff18;
  array<pbrt::WrapMode,_2> in_stack_ffffffffffffff24;
  Tuple2<pbrt::Point2,_int> in_stack_ffffffffffffff2c;
  int local_58;
  RGB local_54;
  Tuple2<pbrt::Point2,_int> local_48;
  int local_40;
  Tuple2<pbrt::Point2,_int> local_3c;
  int local_34;
  undefined1 auVar12 [56];
  undefined1 auVar17 [56];
  
  SampledSpectrum::SampledSpectrum(in_stack_fffffffffffffea0,in_stack_fffffffffffffe9c);
  local_34 = 0;
  while( true ) {
    iVar21 = local_34;
    local_3c = (Tuple2<pbrt::Point2,_int>)Image::Resolution((Image *)(in_RDI + 0xb8));
    if (local_3c.y <= iVar21) break;
    local_40 = 0;
    while( true ) {
      iVar21 = local_40;
      local_48 = (Tuple2<pbrt::Point2,_int>)Image::Resolution((Image *)(in_RDI + 0xb8));
      if (local_48.x <= iVar21) break;
      RGB::RGB(&local_54);
      for (local_58 = 0; local_58 < 3; local_58 = local_58 + 1) {
        in_stack_fffffffffffffed8 = (SampledWavelengths *)(in_RDI + 0xb8);
        Point2<int>::Point2((Point2<int> *)in_stack_fffffffffffffea0,(int)in_stack_fffffffffffffe9c,
                            (int)in_stack_fffffffffffffe98);
        in_stack_fffffffffffffee0 = local_58;
        WrapMode2D::WrapMode2D
                  ((WrapMode2D *)CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0),
                   in_stack_fffffffffffffeac);
        in_stack_fffffffffffffee4 =
             Image::GetChannel(in_stack_ffffffffffffff18,(Point2i)in_stack_ffffffffffffff2c,
                               (int)((ulong)in_stack_ffffffffffffff10 >> 0x20),
                               (WrapMode2D)in_stack_ffffffffffffff24.values);
        pFVar4 = RGB::operator[](&local_54,local_58);
        *pFVar4 = in_stack_fffffffffffffee4;
      }
      in_stack_fffffffffffffeb4 = 0x3f000000;
      in_stack_fffffffffffffeb0 = (float)local_40 + 0.5;
      Image::Resolution((Image *)(in_RDI + 0xb8));
      Image::Resolution((Image *)(in_RDI + 0xb8));
      auVar12 = (undefined1  [56])0x0;
      auVar17 = ZEXT856(0);
      Point2<float>::Point2
                ((Point2<float> *)in_stack_fffffffffffffea0,in_stack_fffffffffffffe9c,
                 in_stack_fffffffffffffe98);
      VVar18 = RenderFromImage(in_stack_ffffffffffffff10,&in_stack_ffffffffffffff08->r,
                               (Float *)in_stack_ffffffffffffff00);
      auVar6._0_8_ = VVar18.super_Tuple3<pbrt::Vector3,_float>._0_8_;
      auVar6._8_56_ = auVar12;
      vmovlpd_avx(auVar6._0_16_);
      RGBSpectrum::RGBSpectrum
                ((RGBSpectrum *)in_stack_ffffffffffffff10,in_stack_ffffffffffffff08,
                 (RGB *)in_stack_ffffffffffffff00);
      SVar19 = RGBSpectrum::Sample((RGBSpectrum *)
                                   CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0),
                                   in_stack_fffffffffffffed8);
      auVar13._0_8_ = SVar19.values.values._8_8_;
      auVar13._8_56_ = auVar17;
      auVar7._0_8_ = SVar19.values.values._0_8_;
      auVar7._8_56_ = auVar12;
      vmovlpd_avx(auVar7._0_16_);
      vmovlpd_avx(auVar13._0_16_);
      auVar12 = (undefined1  [56])0x0;
      SVar19 = SampledSpectrum::operator/
                         ((SampledSpectrum *)
                          CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8),
                          (Float)((ulong)in_stack_fffffffffffffea0 >> 0x20));
      auVar14._0_8_ = SVar19.values.values._8_8_;
      auVar14._8_56_ = auVar17;
      auVar8._0_8_ = SVar19.values.values._0_8_;
      auVar8._8_56_ = auVar12;
      vmovlpd_avx(auVar8._0_16_);
      vmovlpd_avx(auVar14._0_16_);
      SampledSpectrum::operator+=
                ((SampledSpectrum *)CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0),
                 (SampledSpectrum *)CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8));
      local_40 = local_40 + 1;
    }
    local_34 = local_34 + 1;
  }
  uVar20 = *(undefined4 *)(in_RDI + 0x1d8);
  Area(in_stack_ffffffffffffff00);
  auVar17 = ZEXT856(extraout_XMM0_Qb);
  auVar12 = (undefined1  [56])0x0;
  SVar19 = pbrt::operator*((Float)((ulong)in_stack_fffffffffffffea0 >> 0x20),
                           (SampledSpectrum *)CONCAT44(uVar20,in_stack_fffffffffffffe98));
  auVar15._0_8_ = SVar19.values.values._8_8_;
  auVar15._8_56_ = auVar17;
  auVar9._0_8_ = SVar19.values.values._0_8_;
  auVar9._8_56_ = auVar12;
  uVar11 = auVar12._0_8_;
  vmovlpd_avx(auVar9._0_16_);
  vmovlpd_avx(auVar15._0_16_);
  this_00 = (Image *)(in_RDI + 0xb8);
  PVar5 = Image::Resolution(this_00);
  iVar21 = PVar5.super_Tuple2<pbrt::Point2,_int>.x;
  Image::Resolution(this_00);
  auVar12 = ZEXT856(uVar11);
  SVar19 = SampledSpectrum::operator/
                     ((SampledSpectrum *)CONCAT44(iVar21,in_stack_fffffffffffffea8),
                      (Float)((ulong)this_00 >> 0x20));
  auVar16._0_8_ = SVar19.values.values._8_8_;
  auVar16._8_56_ = auVar17;
  auVar10._0_8_ = SVar19.values.values._0_8_;
  auVar10._8_56_ = auVar12;
  uVar1 = vmovlpd_avx(auVar10._0_16_);
  uVar2 = vmovlpd_avx(auVar16._0_16_);
  aVar3.values[2] = (float)(int)uVar2;
  aVar3.values[3] = (float)(int)((ulong)uVar2 >> 0x20);
  aVar3.values[0] = (float)(int)uVar1;
  aVar3.values[1] = (float)(int)((ulong)uVar1 >> 0x20);
  return (array<float,_4>)(array<float,_4>)aVar3.values;
}

Assistant:

SampledSpectrum PortalImageInfiniteLight::Phi(const SampledWavelengths &lambda) const {
    // We're really computing fluence, then converting to power, for what
    // that's worth..
    SampledSpectrum sumL(0.);

    for (int y = 0; y < image.Resolution().y; ++y) {
        for (int x = 0; x < image.Resolution().x; ++x) {
            RGB rgb;
            for (int c = 0; c < 3; ++c)
                rgb[c] = image.GetChannel({x, y}, c);

            Point2f st((x + 0.5f) / image.Resolution().x,
                       (y + 0.5f) / image.Resolution().y);
            Float duv_dw;
            (void)RenderFromImage(st, &duv_dw);

            sumL += RGBSpectrum(*imageColorSpace, rgb).Sample(lambda) / duv_dw;
        }
    }

    return scale * Area() * sumL / (image.Resolution().x * image.Resolution().y);
}